

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compile.cc
# Opt level: O3

Frag __thiscall duckdb_re2::Compiler::Star(Compiler *this,Frag a,bool nongreedy)

{
  uint uVar1;
  undefined8 uVar2;
  uint uVar3;
  Inst *pIVar4;
  uint uVar5;
  Frag FVar6;
  Frag FVar7;
  uint uStack_58;
  int iStack_54;
  uint uStack_3c;
  
  if ((a._8_8_ >> 0x20 & 1) == 0) {
    uVar1 = AllocInst(this,1);
    if ((int)uVar1 < 0) {
      uVar2 = 0;
      uStack_58 = 0;
      iStack_54 = (uint)iStack_54._1_3_ << 8;
    }
    else {
      pIVar4 = (this->inst_).ptr_._M_t.
               super___uniq_ptr_impl<duckdb_re2::Prog::Inst,_duckdb_re2::PODArray<duckdb_re2::Prog::Inst>::Deleter>
               ._M_t.
               super__Tuple_impl<0UL,_duckdb_re2::Prog::Inst_*,_duckdb_re2::PODArray<duckdb_re2::Prog::Inst>::Deleter>
               .super__Head_base<0UL,_duckdb_re2::Prog::Inst_*,_false>._M_head_impl + uVar1;
      uVar5 = uVar1 * 2;
      if (nongreedy) {
        Prog::Inst::InitAlt(pIVar4,0,a.begin);
      }
      else {
        Prog::Inst::InitAlt(pIVar4,a.begin,0);
        uVar5 = uVar5 | 1;
      }
      uStack_3c = a.end.head;
      if (uStack_3c != 0) {
        pIVar4 = (this->inst_).ptr_._M_t.
                 super___uniq_ptr_impl<duckdb_re2::Prog::Inst,_duckdb_re2::PODArray<duckdb_re2::Prog::Inst>::Deleter>
                 ._M_t.
                 super__Tuple_impl<0UL,_duckdb_re2::Prog::Inst_*,_duckdb_re2::PODArray<duckdb_re2::Prog::Inst>::Deleter>
                 .super__Head_base<0UL,_duckdb_re2::Prog::Inst_*,_false>._M_head_impl;
        do {
          uVar3 = uStack_3c >> 1;
          if ((uStack_3c & 1) == 0) {
            uStack_3c = pIVar4[uVar3].out_opcode_ >> 4;
            pIVar4[uVar3].out_opcode_ = pIVar4[uVar3].out_opcode_ & 0xf | uVar1 << 4;
          }
          else {
            uStack_3c = pIVar4[uVar3].field_1.out1_;
            pIVar4[uVar3].field_1.cap_ = uVar1;
          }
        } while (uStack_3c != 0);
      }
      uStack_58 = uVar5 / 1;
      iStack_54 = CONCAT31(iStack_54._1_3_,1);
      uVar2 = CONCAT44(uVar5,uVar1);
    }
  }
  else {
    FVar6 = Plus(this,a,nongreedy);
    FVar7._8_8_ = FVar6._8_8_ & 0xffffffffff;
    FVar7.begin = (int)FVar6._0_8_;
    FVar7.end.head = (int)((ulong)FVar6._0_8_ >> 0x20);
    FVar7 = Quest(this,FVar7,nongreedy);
    uVar2 = FVar7._0_8_;
    uStack_58 = FVar7.end.tail;
    iStack_54 = CONCAT31(iStack_54._1_3_,FVar7.nullable);
  }
  FVar6._12_4_ = iStack_54;
  FVar6.end.tail = uStack_58;
  FVar6.begin = (int)uVar2;
  FVar6.end.head = (int)((ulong)uVar2 >> 0x20);
  return FVar6;
}

Assistant:

Frag Compiler::Star(Frag a, bool nongreedy) {
  // When the subexpression is nullable, one Alt isn't enough to guarantee
  // correct priority ordering within the transitive closure. The simplest
  // solution is to handle it as (a+)? instead, which adds the second Alt.
  if (a.nullable)
    return Quest(Plus(a, nongreedy), nongreedy);

  int id = AllocInst(1);
  if (id < 0)
    return NoMatch();
  PatchList pl;
  if (nongreedy) {
    inst_[id].InitAlt(0, a.begin);
    pl = PatchList::Mk(id << 1);
  } else {
    inst_[id].InitAlt(a.begin, 0);
    pl = PatchList::Mk((id << 1) | 1);
  }
  PatchList::Patch(inst_.data(), a.end, id);
  return Frag(id, pl, true);
}